

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O1

void __thiscall
cs::statement_block::statement_block
          (statement_block *this,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *block,context_t *c,
          token_base *ptr)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  peVar1 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_00251d78;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  (this->super_statement_base).line_num = ptr->line_num;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_block_00257570;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&(this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,
             &block->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
  ;
  return;
}

Assistant:

statement_block(std::deque<statement_base *> block, context_t c, token_base *ptr) : statement_base(std::move(c),
			        ptr),
			mBlock(std::move(block)) {}